

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPsocket.h
# Opt level: O1

int __thiscall UDPsocket::bind(UDPsocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  int opt;
  undefined1 local_14 [4];
  
  uVar1 = (ushort)((uint *)CONCAT44(in_register_00000034,__fd))[1];
  *(ulong *)&this->self_addr =
       (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) * 0x10000 +
       ((ulong)*(uint *)CONCAT44(in_register_00000034,__fd) << 0x20) + 2;
  (this->self_addr).sin_zero[0] = '\0';
  (this->self_addr).sin_zero[1] = '\0';
  (this->self_addr).sin_zero[2] = '\0';
  (this->self_addr).sin_zero[3] = '\0';
  (this->self_addr).sin_zero[4] = '\0';
  (this->self_addr).sin_zero[5] = '\0';
  (this->self_addr).sin_zero[6] = '\0';
  (this->self_addr).sin_zero[7] = '\0';
  this->self_addr_len = 0x10;
  iVar2 = setsockopt(this->sock,1,2,local_14,4);
  if (iVar2 < 0) {
    uVar3 = 0xfffffffb;
  }
  else {
    iVar2 = ::bind(this->sock,(sockaddr *)&this->self_addr,this->self_addr_len);
    if (iVar2 < 0) {
      uVar3 = 0xfffffffc;
    }
    else {
      iVar2 = getsockname(this->sock,(sockaddr *)&this->self_addr,&this->self_addr_len);
      uVar3 = iVar2 >> 0x1f & 0xfffffffa;
    }
  }
  return uVar3;
}

Assistant:

int bind(const IPv4& ipaddr)
	{
		self_addr = ipaddr;
		self_addr_len = sizeof(self_addr);
		int opt = 1;
		int ret = ::setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (const char*)&opt, sizeof(opt));
		if (ret < 0) {
			return (int)Status::SetSockOptError;
		}
		ret = ::bind(sock, (sockaddr_t*)&self_addr, self_addr_len);
		if (ret < 0) {
			return (int)Status::BindError;
		}
		ret = ::getsockname(sock, (sockaddr_t*)&self_addr, &self_addr_len);
		if (ret < 0) {
			return (int)Status::GetSockNameError;
		}
		return (int)Status::OK;
	}